

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l3_full.c
# Opt level: O1

int picnic_l3_full_sk_to_pk(picnic_l3_full_privatekey_t *sk,picnic_l3_full_publickey_t *pk)

{
  undefined8 uVar1;
  int iVar2;
  picnic_instance_t *lowmc;
  mzd_local_t plaintext [1];
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t mStack_c0;
  mzd_local_t local_a0;
  mzd_local_t local_80 [2];
  
  iVar2 = -1;
  if (pk != (picnic_l3_full_publickey_t *)0x0 && sk != (picnic_l3_full_privatekey_t *)0x0) {
    lowmc = picnic_instance_get(Picnic_L3_full);
    mzd_from_char_array(&mStack_c0,sk->data + 0x30,0x18);
    mzd_from_char_array(local_80,sk->data,0x18);
    lowmc_compute(&lowmc->lowmc,local_80,&mStack_c0,&local_a0);
    *(undefined8 *)(pk->data + 0x28) = *(undefined8 *)(sk->data + 0x40);
    uVar1 = *(undefined8 *)(sk->data + 0x38);
    *(undefined8 *)(pk->data + 0x18) = *(undefined8 *)(sk->data + 0x30);
    *(undefined8 *)(pk->data + 0x20) = uVar1;
    mzd_to_char_array(pk->data,&local_a0,0x18);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l3_full_sk_to_pk(const picnic_l3_full_privatekey_t* sk,
                                                    picnic_l3_full_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  uint8_t* pk_c        = PK_C(pk);
  uint8_t* pk_pt       = PK_PT(pk);
  const uint8_t* sk_pt = SK_PT(sk);

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  memcpy(pk_pt, sk_pt, LOWMC_BLOCK_SZ);
  mzd_to_char_array(pk_c, ciphertext, LOWMC_BLOCK_SZ);

  return 0;
}